

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O3

void Unit_exponent(int val)

{
  unit *puVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  puVar1 = usp;
  if (UnitsOn == '\x01') {
    if (usp < unit_stack) {
      __assert_fail("usp >= unit_stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                    ,0x149,"void Unit_exponent()");
    }
    lVar2 = 8;
    do {
      puVar1->dim[lVar2 + -8] = puVar1->dim[lVar2 + -8] * (char)val;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x12);
    if (1 < val) {
      iVar3 = val + -1;
      dVar4 = puVar1->factor;
      do {
        dVar4 = dVar4 * puVar1->factor;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      puVar1->factor = dVar4;
    }
  }
  return;
}

Assistant:

void Unit_exponent(val)
	int val;
{
	/* multiply top of stack by val and leave on stack */
	int i;
	double d;
	
	IFUNITS
	assert(usp >= unit_stack);
	for (i=0; i<NDIM; i++) {
		usp->dim[i] *= val;
	}
	d = usp->factor;
	for (i=1; i<val; i++) {
		usp->factor *= d;
	}
}